

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::MeshLoader::loadTexCoordsSourceElement(MeshLoader *this,InputShared *input)

{
  bool bVar1;
  MeshLoader *this_00;
  ostream *poVar2;
  String *pSVar3;
  MeshLoader *this_01;
  URI *copyFrom_;
  Semantic semantic;
  String sourceId;
  URI inputUrl;
  Semantic local_134;
  String local_130;
  undefined1 local_110 [232];
  
  local_134 = (input->super_InputUnshared).mSemantic;
  if ((local_134 != TEXCOORD) && (local_134 != UV)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "The current input element is not a UV / TEXCOORD element!");
    std::endl<char,std::char_traits<char>>(poVar2);
    return false;
  }
  copyFrom_ = &(input->super_InputUnshared).mSource;
  COLLADABU::URI::URI((URI *)local_110,copyFrom_,false);
  std::__cxx11::string::string((string *)&local_130,(string *)(local_110 + 0xc0));
  this_00 = (MeshLoader *)
            SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&local_130);
  if ((this_00 == (MeshLoader *)0x0) ||
     (this_01 = this_00, bVar1 = SourceBase::isLoadedInputElement((SourceBase *)this_00,&local_134),
     bVar1)) {
    bVar1 = false;
  }
  else {
    if ((this_00->super_SourceArrayLoader).mSourceArray.mCount - 5 < 0xfffffffffffffffd) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"The uv source ");
      pSVar3 = COLLADABU::URI::getURIString_abi_cxx11_(copyFrom_);
      poVar2 = std::operator<<(poVar2,(string *)pSVar3);
      poVar2 = std::operator<<(poVar2," has a wrong dimension of ");
      poVar2 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar2);
      poVar2 = std::operator<<(poVar2,". Dimensions between 2 and 4 are allowed. ");
      std::endl<char,std::char_traits<char>>(poVar2);
      bVar1 = false;
    }
    else {
      bVar1 = appendVertexValues(this_01,(SourceBase *)this_00,&this->mMesh->mUVCoords);
    }
    SourceBase::addLoadedInputElement((SourceBase *)this_00,&local_134);
  }
  std::__cxx11::string::~string((string *)&local_130);
  COLLADABU::URI::~URI((URI *)local_110);
  return bVar1;
}

Assistant:

bool MeshLoader::loadTexCoordsSourceElement ( const InputShared& input )
    {
        bool retValue = true;

        // Get the semantic of the current input element.
        InputSemantic::Semantic semantic = input.getSemantic ();
        if ( semantic != InputSemantic::UV && semantic != InputSemantic::TEXCOORD )
        {
            std::cerr << "The current input element is not a UV / TEXCOORD element!" << std::endl;
            return false;
        }

        // Get the source element with the uri of the input element.
        COLLADABU::URI inputUrl = input.getSource ();
        String sourceId = inputUrl.getFragment ();
        SourceBase* sourceBase = getSourceById ( sourceId );
        if ( sourceBase == 0 ) return false;

        // Check if the source element is already loaded.
        if ( sourceBase->isLoadedInputElement ( semantic ) ) return false;

        // Get the stride of the uv coordinates. 
        // This is the dimension of the uv coordinates.
        // In depend on the dimension, we store the coordinates in the mesh.
        unsigned long long stride = sourceBase->getStride ();
        if ( stride < 2 || stride > 4 )
        {
            std::cerr << "The uv source " <<  input.getSource().getURIString () 
                << " has a wrong dimension of " << stride 
                << ". Dimensions between 2 and 4 are allowed. " << std::endl;
            retValue = false;
        }
        else
        {
            COLLADAFW::MeshVertexData& uvCoords = mMesh->getUVCoords ();
            retValue = appendVertexValues ( sourceBase, uvCoords );
        }

        // Set the source base as loaded element.
        sourceBase->addLoadedInputElement ( semantic );

        return retValue;
    }